

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O0

int __thiscall libtorrent::lazy_entry::capacity(lazy_entry *this)

{
  lazy_entry *this_local;
  
  if ((this->m_data).dict == (lazy_dict_entry *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (*(uint *)&this->field_0x14 >> 0x1d == 1) {
    this_local._4_4_ = (((this->m_data).dict)->val).m_len;
  }
  else {
    this_local._4_4_ = ((this->m_data).list)->m_len;
  }
  return this_local._4_4_;
}

Assistant:

int lazy_entry::capacity() const
	{
		TORRENT_ASSERT(m_type == dict_t || m_type == list_t);
		if (m_data.list == nullptr) return 0;
		if (m_type == dict_t)
			return int(m_data.dict[0].val.m_len);
		else
			return int(m_data.list[0].m_len);
	}